

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O0

vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> * __thiscall
QPDFOutlineDocumentHelper::getOutlinesForPage
          (vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
           *__return_storage_ptr__,QPDFOutlineDocumentHelper *this,QPDFObjGen og)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  mapped_type *__x;
  QPDFOutlineDocumentHelper *this_local;
  QPDFObjGen og_local;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *result;
  
  this_local = (QPDFOutlineDocumentHelper *)og;
  og_local = (QPDFObjGen)__return_storage_ptr__;
  peVar2 = std::
           __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  bVar1 = std::
          map<QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>_>
          ::empty(&peVar2->by_page);
  if (bVar1) {
    initializeByPage(this);
  }
  std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::vector
            (__return_storage_ptr__);
  peVar2 = std::
           __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  sVar3 = std::
          map<QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>_>
          ::count(&peVar2->by_page,(key_type *)&this_local);
  if (sVar3 != 0) {
    peVar2 = std::
             __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m);
    __x = std::
          map<QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>_>
          ::operator[](&peVar2->by_page,(key_type *)&this_local);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::operator=
              (__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFOutlineObjectHelper>
QPDFOutlineDocumentHelper::getOutlinesForPage(QPDFObjGen og)
{
    if (m->by_page.empty()) {
        initializeByPage();
    }
    std::vector<QPDFOutlineObjectHelper> result;
    if (m->by_page.count(og)) {
        result = m->by_page[og];
    }
    return result;
}